

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&>::~MatcherBase
          (MatcherBase<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002e1c58;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }